

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O0

int gauden_compute_euclidean(float64 ***out,uint32 ***w_idx,vector_t *obs,gauden_t *g)

{
  uint local_30;
  uint local_2c;
  uint32 j;
  uint32 i;
  gauden_t *g_local;
  vector_t *obs_local;
  uint32 ***w_idx_local;
  float64 ***out_local;
  
  for (local_2c = 0; local_2c < g->n_mgau; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < g->n_feat; local_30 = local_30 + 1) {
      euclidean_dist(out[local_2c][local_30],w_idx[local_2c][local_30],g->n_top,g->n_density,
                     g->veclen[local_30],obs[local_30],g->mean[local_2c][local_30]);
    }
  }
  return 0;
}

Assistant:

int
gauden_compute_euclidean(float64 ***out,
			 uint32 ***w_idx,
			 vector_t *obs,
			 gauden_t *g)
{
    uint32 i, j;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {

	    euclidean_dist(out[i][j],
			   w_idx[i][j],
			   g->n_top,
			   g->n_density,
			   g->veclen[j],
			   obs[j],
			   g->mean[i][j]);
	    
#ifdef GAUDEN_VERBOSE
	    gauden_print(stdout,
			 out, w_idx, g,
			 NULL, 0);
#endif
	}
    }

    return S3_SUCCESS;
}